

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.h
# Opt level: O0

QString * fixEnvVariables(QString *x)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_RDI,in_RDI);
  Option::fixString(in_stack_00000020,x._7_1_);
  QString::~QString((QString *)0x17895e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QString fixEnvVariables(const QString &x) { return Option::fixString(x, Option::FixEnvVars); }